

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O3

void capnp::_::anon_unknown_133::dynamicCheckListDefaults<capnp::DynamicStruct::Builder>
               (Builder reader)

{
  int iVar1;
  ListElementCount LVar2;
  BuilderFor<bool> BVar3;
  uint8_t uVar4;
  uint16_t uVar5;
  uint32_t uVar6;
  size_type sVar7;
  bool bVar8;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StringPtr name_08;
  StringPtr name_09;
  StringPtr name_10;
  StringPtr name_11;
  StringPtr name_12;
  StringPtr name_13;
  StringPtr name_14;
  StringPtr name_15;
  StringPtr name_16;
  StringPtr name_17;
  StringPtr name_18;
  StringPtr name_19;
  StringPtr name_20;
  StringPtr name_21;
  StringPtr name_22;
  StringPtr name_23;
  StringPtr name_24;
  StringPtr name_25;
  StringPtr name_26;
  StringPtr name_27;
  StringPtr name_28;
  StringPtr name_29;
  StringPtr name_30;
  StringPtr name_31;
  StringPtr name_32;
  StringPtr name_33;
  StringPtr name_34;
  StringPtr name_35;
  StringPtr name_36;
  StringPtr name_37;
  StringPtr name_38;
  StringPtr name_39;
  StringPtr name_40;
  StringPtr name_41;
  StringPtr name_42;
  StringPtr name_43;
  StringPtr name_44;
  StringPtr name_45;
  StringPtr name_46;
  StringPtr name_47;
  StringPtr name_48;
  StringPtr name_49;
  StringPtr name_50;
  StringPtr name_51;
  StringPtr name_52;
  StringPtr name_53;
  StringPtr name_54;
  StringPtr name_55;
  StringPtr name_56;
  StringPtr name_57;
  StringPtr name_58;
  StringPtr name_59;
  StringPtr name_60;
  StringPtr name_61;
  StringPtr name_62;
  StringPtr name_63;
  initializer_list<int> expected;
  initializer_list<int> expected_00;
  initializer_list<int> expected_01;
  StringPtr name_64;
  initializer_list<capnp::Text::Reader> expected_02;
  initializer_list<capnp::Text::Reader> expected_03;
  initializer_list<capnp::Text::Reader> expected_04;
  StringPtr name_65;
  StringPtr name_66;
  StringPtr name_67;
  StringPtr name_68;
  StringPtr name_69;
  StringPtr name_70;
  StringPtr name_71;
  StringPtr name_72;
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_23;
  BuilderFor<capnp::DynamicList> l;
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition;
  undefined4 uStack_2c0;
  DebugComparison<const_capnp::Void_&,_capnp::Void> _kjCondition_7;
  Fault f;
  CapTableBuilder *pCStack_258;
  uint uStack_248;
  bool local_240;
  DebugComparison<int,_int> _kjCondition_27;
  char *local_200;
  BuilderFor<Text> local_1f8;
  BuilderFor<capnp::DynamicStruct> lists;
  Builder local_1b0;
  Builder local_170;
  Builder local_130;
  Builder local_f0;
  Builder local_b0;
  Builder local_70;
  
  name.content.size_ = 6;
  name.content.ptr = "lists";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_23,&reader,name);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            (&lists,(Builder *)&_kjCondition_23);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
  name_00.content.size_ = 6;
  name_00.content.ptr = "list0";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_23,&lists,name_00);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            (&l,(Builder *)&_kjCondition_23);
  LVar2 = l.builder.elementCount;
  _kjCondition.right = l.builder.elementCount;
  _kjCondition.left = 2;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = l.builder.elementCount == 2;
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
  if (LVar2 != 2) {
    _kjCondition_27.left = 2;
    name_66.content.size_ = 6;
    name_66.content.ptr = "list0";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_23,&lists,name_66);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              (&l,(Builder *)&_kjCondition_23);
    _kjCondition_7.left = (Void *)CONCAT44(_kjCondition_7.left._4_4_,l.builder.elementCount);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x30c,FAILED,"(2u) == (lists.get(\"list0\").template as<DynamicList>().size())",
               "_kjCondition,2u, lists.get(\"list0\").template as<DynamicList>().size()",
               &_kjCondition,(uint *)&_kjCondition_27,(uint *)&_kjCondition_7);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
    kj::_::Debug::Fault::fatal(&f);
  }
  name_01.content.size_ = 6;
  name_01.content.ptr = "list1";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_23,&lists,name_01);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            (&l,(Builder *)&_kjCondition_23);
  LVar2 = l.builder.elementCount;
  _kjCondition.result = l.builder.elementCount == 4;
  _kjCondition.right = l.builder.elementCount;
  _kjCondition.left = 4;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
  if (LVar2 != 4) {
    _kjCondition_27.left = 4;
    name_67.content.size_ = 6;
    name_67.content.ptr = "list1";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_23,&lists,name_67);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              (&l,(Builder *)&_kjCondition_23);
    _kjCondition_7.left = (Void *)CONCAT44(_kjCondition_7.left._4_4_,l.builder.elementCount);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x30d,FAILED,"(4u) == (lists.get(\"list1\").template as<DynamicList>().size())",
               "_kjCondition,4u, lists.get(\"list1\").template as<DynamicList>().size()",
               &_kjCondition,(uint *)&_kjCondition_27,(uint *)&_kjCondition_7);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
    kj::_::Debug::Fault::fatal(&f);
  }
  name_02.content.size_ = 6;
  name_02.content.ptr = "list8";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_23,&lists,name_02);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            (&l,(Builder *)&_kjCondition_23);
  LVar2 = l.builder.elementCount;
  _kjCondition.result = l.builder.elementCount == 2;
  _kjCondition.right = l.builder.elementCount;
  _kjCondition.left = 2;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
  if (LVar2 != 2) {
    _kjCondition_27.left = 2;
    name_68.content.size_ = 6;
    name_68.content.ptr = "list8";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_23,&lists,name_68);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              (&l,(Builder *)&_kjCondition_23);
    _kjCondition_7.left = (Void *)CONCAT44(_kjCondition_7.left._4_4_,l.builder.elementCount);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x30e,FAILED,"(2u) == (lists.get(\"list8\").template as<DynamicList>().size())",
               "_kjCondition,2u, lists.get(\"list8\").template as<DynamicList>().size()",
               &_kjCondition,(uint *)&_kjCondition_27,(uint *)&_kjCondition_7);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
    kj::_::Debug::Fault::fatal(&f);
  }
  name_03.content.size_ = 7;
  name_03.content.ptr = "list16";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_23,&lists,name_03);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            (&l,(Builder *)&_kjCondition_23);
  LVar2 = l.builder.elementCount;
  _kjCondition.result = l.builder.elementCount == 2;
  _kjCondition.right = l.builder.elementCount;
  _kjCondition.left = 2;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
  if (LVar2 != 2) {
    _kjCondition_27.left = 2;
    name_69.content.size_ = 7;
    name_69.content.ptr = "list16";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_23,&lists,name_69);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              (&l,(Builder *)&_kjCondition_23);
    _kjCondition_7.left = (Void *)CONCAT44(_kjCondition_7.left._4_4_,l.builder.elementCount);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x30f,FAILED,"(2u) == (lists.get(\"list16\").template as<DynamicList>().size())",
               "_kjCondition,2u, lists.get(\"list16\").template as<DynamicList>().size()",
               &_kjCondition,(uint *)&_kjCondition_27,(uint *)&_kjCondition_7);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
    kj::_::Debug::Fault::fatal(&f);
  }
  name_04.content.size_ = 7;
  name_04.content.ptr = "list32";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_23,&lists,name_04);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            (&l,(Builder *)&_kjCondition_23);
  LVar2 = l.builder.elementCount;
  _kjCondition.result = l.builder.elementCount == 2;
  _kjCondition.right = l.builder.elementCount;
  _kjCondition.left = 2;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
  if (LVar2 != 2) {
    _kjCondition_27.left = 2;
    name_70.content.size_ = 7;
    name_70.content.ptr = "list32";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_23,&lists,name_70);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              (&l,(Builder *)&_kjCondition_23);
    _kjCondition_7.left = (Void *)CONCAT44(_kjCondition_7.left._4_4_,l.builder.elementCount);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x310,FAILED,"(2u) == (lists.get(\"list32\").template as<DynamicList>().size())",
               "_kjCondition,2u, lists.get(\"list32\").template as<DynamicList>().size()",
               &_kjCondition,(uint *)&_kjCondition_27,(uint *)&_kjCondition_7);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
    kj::_::Debug::Fault::fatal(&f);
  }
  name_05.content.size_ = 7;
  name_05.content.ptr = "list64";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_23,&lists,name_05);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            (&l,(Builder *)&_kjCondition_23);
  LVar2 = l.builder.elementCount;
  _kjCondition.result = l.builder.elementCount == 2;
  _kjCondition.right = l.builder.elementCount;
  _kjCondition.left = 2;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
  if (LVar2 != 2) {
    _kjCondition_27.left = 2;
    name_71.content.size_ = 7;
    name_71.content.ptr = "list64";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_23,&lists,name_71);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              (&l,(Builder *)&_kjCondition_23);
    _kjCondition_7.left = (Void *)CONCAT44(_kjCondition_7.left._4_4_,l.builder.elementCount);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x311,FAILED,"(2u) == (lists.get(\"list64\").template as<DynamicList>().size())",
               "_kjCondition,2u, lists.get(\"list64\").template as<DynamicList>().size()",
               &_kjCondition,(uint *)&_kjCondition_27,(uint *)&_kjCondition_7);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
    kj::_::Debug::Fault::fatal(&f);
  }
  name_06.content.size_ = 6;
  name_06.content.ptr = "listP";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_23,&lists,name_06);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            (&l,(Builder *)&_kjCondition_23);
  LVar2 = l.builder.elementCount;
  _kjCondition.right = l.builder.elementCount;
  _kjCondition.left = 2;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = l.builder.elementCount == 2;
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
  if (LVar2 != 2) {
    _kjCondition_27.left = 2;
    name_72.content.size_ = 6;
    name_72.content.ptr = "listP";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_23,&lists,name_72);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              (&l,(Builder *)&_kjCondition_23);
    _kjCondition_7.left = (Void *)CONCAT44(_kjCondition_7.left._4_4_,l.builder.elementCount);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x312,FAILED,"(2u) == (lists.get(\"listP\").template as<DynamicList>().size())",
               "_kjCondition,2u, lists.get(\"listP\").template as<DynamicList>().size()",
               &_kjCondition,(uint *)&_kjCondition_27,(uint *)&_kjCondition_7);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
    kj::_::Debug::Fault::fatal(&f);
  }
  name_07.content.size_ = 6;
  name_07.content.ptr = "list0";
  DynamicStruct::Builder::get((Builder *)&_kjCondition,&lists,name_07);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&f,(Builder *)&_kjCondition);
  DynamicList::Builder::operator[]((Builder *)&l,(Builder *)&f,0);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)&_kjCondition_27,(Builder *)&l);
  name_08.content.size_ = 2;
  name_08.content.ptr = "f";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_23,(Builder *)&_kjCondition_27,name_08);
  DynamicValue::Builder::AsImpl<capnp::Void,_(capnp::Kind)0>::apply((Builder *)&_kjCondition_23);
  _kjCondition_7.left = (Void *)&VOID;
  _kjCondition_7.op.content.ptr = " == ";
  _kjCondition_7.op.content.size_ = 5;
  _kjCondition_7.result = true;
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
  DynamicValue::Builder::~Builder((Builder *)&l);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
  if ((_kjCondition_7.result == false) && (kj::_::Debug::minSeverity < 3)) {
    name_09.content.size_ = 6;
    name_09.content.ptr = "list0";
    DynamicStruct::Builder::get((Builder *)&_kjCondition,&lists,name_09);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&f,(Builder *)&_kjCondition);
    DynamicList::Builder::operator[]((Builder *)&l,(Builder *)&f,0);
    DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicStruct> *)&_kjCondition_27,(Builder *)&l);
    name_10.content.size_ = 2;
    name_10.content.ptr = "f";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_23,(Builder *)&_kjCondition_27,name_10);
    DynamicValue::Builder::AsImpl<capnp::Void,_(capnp::Kind)0>::apply((Builder *)&_kjCondition_23);
    kj::_::Debug::
    log<char_const(&)[136],kj::_::DebugComparison<capnp::Void_const&,capnp::Void>&,capnp::Void_const&,capnp::Void>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x314,ERROR,
               "\"failed: expected \" \"(VOID) == (lists.get(\\\"list0\\\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\\\"f\\\").template as<Void>())\", _kjCondition, VOID, lists.get(\"list0\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<Void>()"
               ,(char (*) [136])
                "failed: expected (VOID) == (lists.get(\"list0\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<Void>())"
               ,&_kjCondition_7,(Void *)&VOID,(Void *)&local_1f8);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
    DynamicValue::Builder::~Builder((Builder *)&l);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
  }
  name_11.content.size_ = 6;
  name_11.content.ptr = "list0";
  DynamicStruct::Builder::get((Builder *)&_kjCondition,&lists,name_11);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&f,(Builder *)&_kjCondition);
  DynamicList::Builder::operator[]((Builder *)&l,(Builder *)&f,1);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)&_kjCondition_27,(Builder *)&l);
  name_12.content.size_ = 2;
  name_12.content.ptr = "f";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_23,(Builder *)&_kjCondition_27,name_12);
  DynamicValue::Builder::AsImpl<capnp::Void,_(capnp::Kind)0>::apply((Builder *)&_kjCondition_23);
  _kjCondition_7.left = (Void *)&VOID;
  _kjCondition_7.op.content.ptr = " == ";
  _kjCondition_7.op.content.size_ = 5;
  _kjCondition_7.result = true;
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
  DynamicValue::Builder::~Builder((Builder *)&l);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
  if ((_kjCondition_7.result == false) && (kj::_::Debug::minSeverity < 3)) {
    name_13.content.size_ = 6;
    name_13.content.ptr = "list0";
    DynamicStruct::Builder::get((Builder *)&_kjCondition,&lists,name_13);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&f,(Builder *)&_kjCondition);
    DynamicList::Builder::operator[]((Builder *)&l,(Builder *)&f,1);
    DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicStruct> *)&_kjCondition_27,(Builder *)&l);
    name_14.content.size_ = 2;
    name_14.content.ptr = "f";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_23,(Builder *)&_kjCondition_27,name_14);
    DynamicValue::Builder::AsImpl<capnp::Void,_(capnp::Kind)0>::apply((Builder *)&_kjCondition_23);
    kj::_::Debug::
    log<char_const(&)[136],kj::_::DebugComparison<capnp::Void_const&,capnp::Void>&,capnp::Void_const&,capnp::Void>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x315,ERROR,
               "\"failed: expected \" \"(VOID) == (lists.get(\\\"list0\\\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\\\"f\\\").template as<Void>())\", _kjCondition, VOID, lists.get(\"list0\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<Void>()"
               ,(char (*) [136])
                "failed: expected (VOID) == (lists.get(\"list0\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<Void>())"
               ,&_kjCondition_7,(Void *)&VOID,(Void *)&local_1f8);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
    DynamicValue::Builder::~Builder((Builder *)&l);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
  }
  name_15.content.size_ = 6;
  name_15.content.ptr = "list1";
  DynamicStruct::Builder::get((Builder *)&_kjCondition,&lists,name_15);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&f,(Builder *)&_kjCondition);
  DynamicList::Builder::operator[]((Builder *)&l,(Builder *)&f,0);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)&_kjCondition_27,(Builder *)&l);
  name_16.content.size_ = 2;
  name_16.content.ptr = "f";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_23,(Builder *)&_kjCondition_27,name_16);
  BVar3 = DynamicValue::Builder::AsImpl<bool,_(capnp::Kind)0>::apply((Builder *)&_kjCondition_23);
  _kjCondition_7.left = (Void *)CONCAT71(_kjCondition_7.left._1_7_,BVar3);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
  DynamicValue::Builder::~Builder((Builder *)&l);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
  if (((char)_kjCondition_7.left == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[124],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x316,ERROR,
               "\"failed: expected \" \"lists.get(\\\"list1\\\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\\\"f\\\").template as<bool>()\", _kjCondition"
               ,(char (*) [124])
                "failed: expected lists.get(\"list1\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<bool>()"
               ,(DebugExpression<bool> *)&_kjCondition_7);
  }
  name_17.content.size_ = 6;
  name_17.content.ptr = "list1";
  DynamicStruct::Builder::get((Builder *)&_kjCondition,&lists,name_17);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&f,(Builder *)&_kjCondition);
  DynamicList::Builder::operator[]((Builder *)&l,(Builder *)&f,1);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)&_kjCondition_27,(Builder *)&l);
  name_18.content.size_ = 2;
  name_18.content.ptr = "f";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_23,(Builder *)&_kjCondition_27,name_18);
  BVar3 = DynamicValue::Builder::AsImpl<bool,_(capnp::Kind)0>::apply((Builder *)&_kjCondition_23);
  _kjCondition_7.left = (Void *)CONCAT71(_kjCondition_7.left._1_7_,!BVar3);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
  DynamicValue::Builder::~Builder((Builder *)&l);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
  if (((char)_kjCondition_7.left == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[127],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x317,ERROR,
               "\"failed: expected \" \"!(lists.get(\\\"list1\\\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\\\"f\\\").template as<bool>())\", _kjCondition"
               ,(char (*) [127])
                "failed: expected !(lists.get(\"list1\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<bool>())"
               ,(DebugExpression<bool> *)&_kjCondition_7);
  }
  name_19.content.size_ = 6;
  name_19.content.ptr = "list1";
  DynamicStruct::Builder::get((Builder *)&_kjCondition,&lists,name_19);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&f,(Builder *)&_kjCondition);
  DynamicList::Builder::operator[]((Builder *)&l,(Builder *)&f,2);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)&_kjCondition_27,(Builder *)&l);
  name_20.content.size_ = 2;
  name_20.content.ptr = "f";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_23,(Builder *)&_kjCondition_27,name_20);
  BVar3 = DynamicValue::Builder::AsImpl<bool,_(capnp::Kind)0>::apply((Builder *)&_kjCondition_23);
  _kjCondition_7.left = (Void *)CONCAT71(_kjCondition_7.left._1_7_,BVar3);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
  DynamicValue::Builder::~Builder((Builder *)&l);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
  if (((char)_kjCondition_7.left == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[124],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x318,ERROR,
               "\"failed: expected \" \"lists.get(\\\"list1\\\").template as<DynamicList>()[2].template as<DynamicStruct>().get(\\\"f\\\").template as<bool>()\", _kjCondition"
               ,(char (*) [124])
                "failed: expected lists.get(\"list1\").template as<DynamicList>()[2].template as<DynamicStruct>().get(\"f\").template as<bool>()"
               ,(DebugExpression<bool> *)&_kjCondition_7);
  }
  name_21.content.size_ = 6;
  name_21.content.ptr = "list1";
  DynamicStruct::Builder::get((Builder *)&_kjCondition,&lists,name_21);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&f,(Builder *)&_kjCondition);
  DynamicList::Builder::operator[]((Builder *)&l,(Builder *)&f,3);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)&_kjCondition_27,(Builder *)&l);
  name_22.content.size_ = 2;
  name_22.content.ptr = "f";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_23,(Builder *)&_kjCondition_27,name_22);
  BVar3 = DynamicValue::Builder::AsImpl<bool,_(capnp::Kind)0>::apply((Builder *)&_kjCondition_23);
  _kjCondition_7.left = (Void *)CONCAT71(_kjCondition_7.left._1_7_,BVar3);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
  DynamicValue::Builder::~Builder((Builder *)&l);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
  if (((char)_kjCondition_7.left == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[124],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x319,ERROR,
               "\"failed: expected \" \"lists.get(\\\"list1\\\").template as<DynamicList>()[3].template as<DynamicStruct>().get(\\\"f\\\").template as<bool>()\", _kjCondition"
               ,(char (*) [124])
                "failed: expected lists.get(\"list1\").template as<DynamicList>()[3].template as<DynamicStruct>().get(\"f\").template as<bool>()"
               ,(DebugExpression<bool> *)&_kjCondition_7);
  }
  name_23.content.size_ = 6;
  name_23.content.ptr = "list8";
  DynamicStruct::Builder::get((Builder *)&_kjCondition,&lists,name_23);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&f,(Builder *)&_kjCondition);
  DynamicList::Builder::operator[]((Builder *)&l,(Builder *)&f,0);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)&_kjCondition_27,(Builder *)&l);
  name_24.content.size_ = 2;
  name_24.content.ptr = "f";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_23,(Builder *)&_kjCondition_27,name_24);
  uVar4 = DynamicValue::Builder::AsImpl<unsigned_char,_(capnp::Kind)0>::apply
                    ((Builder *)&_kjCondition_23);
  _kjCondition_7.left._0_5_ = CONCAT14(uVar4,0x7b);
  _kjCondition_7._8_8_ = anon_var_dwarf_a914;
  _kjCondition_7.op.content.ptr = &DAT_00000005;
  _kjCondition_7.op.content.size_ = CONCAT71(_kjCondition_7.op.content.size_._1_7_,uVar4 == '{');
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
  DynamicValue::Builder::~Builder((Builder *)&l);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
  if (((char)_kjCondition_7.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    local_1f8._0_4_ = 0x7b;
    name_25.content.size_ = 6;
    name_25.content.ptr = "list8";
    DynamicStruct::Builder::get((Builder *)&_kjCondition,&lists,name_25);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&f,(Builder *)&_kjCondition);
    DynamicList::Builder::operator[]((Builder *)&l,(Builder *)&f,0);
    DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicStruct> *)&_kjCondition_27,(Builder *)&l);
    name_26.content.size_ = 2;
    name_26.content.ptr = "f";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_23,(Builder *)&_kjCondition_27,name_26);
    uVar4 = DynamicValue::Builder::AsImpl<unsigned_char,_(capnp::Kind)0>::apply
                      ((Builder *)&_kjCondition_23);
    local_200 = (char *)CONCAT71(local_200._1_7_,uVar4);
    kj::_::Debug::
    log<char_const(&)[139],kj::_::DebugComparison<unsigned_int,unsigned_char>&,unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x31a,ERROR,
               "\"failed: expected \" \"(123u) == (lists.get(\\\"list8\\\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\\\"f\\\").template as<uint8_t>())\", _kjCondition, 123u, lists.get(\"list8\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<uint8_t>()"
               ,(char (*) [139])
                "failed: expected (123u) == (lists.get(\"list8\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<uint8_t>())"
               ,(DebugComparison<unsigned_int,_unsigned_char> *)&_kjCondition_7,(uint *)&local_1f8,
               (uchar *)&local_200);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
    DynamicValue::Builder::~Builder((Builder *)&l);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
  }
  name_27.content.size_ = 6;
  name_27.content.ptr = "list8";
  DynamicStruct::Builder::get((Builder *)&_kjCondition,&lists,name_27);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&f,(Builder *)&_kjCondition);
  DynamicList::Builder::operator[]((Builder *)&l,(Builder *)&f,1);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)&_kjCondition_27,(Builder *)&l);
  name_28.content.size_ = 2;
  name_28.content.ptr = "f";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_23,(Builder *)&_kjCondition_27,name_28);
  uVar4 = DynamicValue::Builder::AsImpl<unsigned_char,_(capnp::Kind)0>::apply
                    ((Builder *)&_kjCondition_23);
  _kjCondition_7.left._0_5_ = CONCAT14(uVar4,0x2d);
  _kjCondition_7._8_8_ = anon_var_dwarf_a914;
  _kjCondition_7.op.content.ptr = &DAT_00000005;
  _kjCondition_7.op.content.size_ = CONCAT71(_kjCondition_7.op.content.size_._1_7_,uVar4 == '-');
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
  DynamicValue::Builder::~Builder((Builder *)&l);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
  if (((char)_kjCondition_7.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    local_1f8._0_4_ = 0x2d;
    name_29.content.size_ = 6;
    name_29.content.ptr = "list8";
    DynamicStruct::Builder::get((Builder *)&_kjCondition,&lists,name_29);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&f,(Builder *)&_kjCondition);
    DynamicList::Builder::operator[]((Builder *)&l,(Builder *)&f,1);
    DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicStruct> *)&_kjCondition_27,(Builder *)&l);
    name_30.content.size_ = 2;
    name_30.content.ptr = "f";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_23,(Builder *)&_kjCondition_27,name_30);
    uVar4 = DynamicValue::Builder::AsImpl<unsigned_char,_(capnp::Kind)0>::apply
                      ((Builder *)&_kjCondition_23);
    local_200 = (char *)CONCAT71(local_200._1_7_,uVar4);
    kj::_::Debug::
    log<char_const(&)[138],kj::_::DebugComparison<unsigned_int,unsigned_char>&,unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x31b,ERROR,
               "\"failed: expected \" \"(45u) == (lists.get(\\\"list8\\\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\\\"f\\\").template as<uint8_t>())\", _kjCondition, 45u, lists.get(\"list8\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<uint8_t>()"
               ,(char (*) [138])
                "failed: expected (45u) == (lists.get(\"list8\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<uint8_t>())"
               ,(DebugComparison<unsigned_int,_unsigned_char> *)&_kjCondition_7,(uint *)&local_1f8,
               (uchar *)&local_200);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
    DynamicValue::Builder::~Builder((Builder *)&l);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
  }
  name_31.content.size_ = 7;
  name_31.content.ptr = "list16";
  DynamicStruct::Builder::get((Builder *)&_kjCondition,&lists,name_31);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&f,(Builder *)&_kjCondition);
  DynamicList::Builder::operator[]((Builder *)&l,(Builder *)&f,0);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)&_kjCondition_27,(Builder *)&l);
  name_32.content.size_ = 2;
  name_32.content.ptr = "f";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_23,(Builder *)&_kjCondition_27,name_32);
  uVar5 = DynamicValue::Builder::AsImpl<unsigned_short,_(capnp::Kind)0>::apply
                    ((Builder *)&_kjCondition_23);
  _kjCondition_7.left._0_6_ = CONCAT24(uVar5,0x3039);
  _kjCondition_7._8_8_ = anon_var_dwarf_a914;
  _kjCondition_7.op.content.ptr = &DAT_00000005;
  _kjCondition_7.op.content.size_ = CONCAT71(_kjCondition_7.op.content.size_._1_7_,uVar5 == 0x3039);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
  DynamicValue::Builder::~Builder((Builder *)&l);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
  if (((char)_kjCondition_7.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    local_1f8._0_4_ = 0x3039;
    name_33.content.size_ = 7;
    name_33.content.ptr = "list16";
    DynamicStruct::Builder::get((Builder *)&_kjCondition,&lists,name_33);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&f,(Builder *)&_kjCondition);
    DynamicList::Builder::operator[]((Builder *)&l,(Builder *)&f,0);
    DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicStruct> *)&_kjCondition_27,(Builder *)&l);
    name_34.content.size_ = 2;
    name_34.content.ptr = "f";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_23,(Builder *)&_kjCondition_27,name_34);
    uVar5 = DynamicValue::Builder::AsImpl<unsigned_short,_(capnp::Kind)0>::apply
                      ((Builder *)&_kjCondition_23);
    local_200 = (char *)CONCAT62(local_200._2_6_,uVar5);
    kj::_::Debug::
    log<char_const(&)[143],kj::_::DebugComparison<unsigned_int,unsigned_short>&,unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x31c,ERROR,
               "\"failed: expected \" \"(12345u) == (lists.get(\\\"list16\\\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\\\"f\\\").template as<uint16_t>())\", _kjCondition, 12345u, lists.get(\"list16\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<uint16_t>()"
               ,(char (*) [143])
                "failed: expected (12345u) == (lists.get(\"list16\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<uint16_t>())"
               ,(DebugComparison<unsigned_int,_unsigned_short> *)&_kjCondition_7,(uint *)&local_1f8,
               (unsigned_short *)&local_200);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
    DynamicValue::Builder::~Builder((Builder *)&l);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
  }
  name_35.content.size_ = 7;
  name_35.content.ptr = "list16";
  DynamicStruct::Builder::get((Builder *)&_kjCondition,&lists,name_35);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&f,(Builder *)&_kjCondition);
  DynamicList::Builder::operator[]((Builder *)&l,(Builder *)&f,1);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)&_kjCondition_27,(Builder *)&l);
  name_36.content.size_ = 2;
  name_36.content.ptr = "f";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_23,(Builder *)&_kjCondition_27,name_36);
  uVar5 = DynamicValue::Builder::AsImpl<unsigned_short,_(capnp::Kind)0>::apply
                    ((Builder *)&_kjCondition_23);
  _kjCondition_7.left._0_6_ = CONCAT24(uVar5,0x1a85);
  _kjCondition_7._8_8_ = anon_var_dwarf_a914;
  _kjCondition_7.op.content.ptr = &DAT_00000005;
  _kjCondition_7.op.content.size_ = CONCAT71(_kjCondition_7.op.content.size_._1_7_,uVar5 == 0x1a85);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
  DynamicValue::Builder::~Builder((Builder *)&l);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
  if (((char)_kjCondition_7.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    local_1f8._0_4_ = 0x1a85;
    name_37.content.size_ = 7;
    name_37.content.ptr = "list16";
    DynamicStruct::Builder::get((Builder *)&_kjCondition,&lists,name_37);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&f,(Builder *)&_kjCondition);
    DynamicList::Builder::operator[]((Builder *)&l,(Builder *)&f,1);
    DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicStruct> *)&_kjCondition_27,(Builder *)&l);
    name_38.content.size_ = 2;
    name_38.content.ptr = "f";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_23,(Builder *)&_kjCondition_27,name_38);
    uVar5 = DynamicValue::Builder::AsImpl<unsigned_short,_(capnp::Kind)0>::apply
                      ((Builder *)&_kjCondition_23);
    local_200 = (char *)CONCAT62(local_200._2_6_,uVar5);
    kj::_::Debug::
    log<char_const(&)[142],kj::_::DebugComparison<unsigned_int,unsigned_short>&,unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x31d,ERROR,
               "\"failed: expected \" \"(6789u) == (lists.get(\\\"list16\\\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\\\"f\\\").template as<uint16_t>())\", _kjCondition, 6789u, lists.get(\"list16\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<uint16_t>()"
               ,(char (*) [142])
                "failed: expected (6789u) == (lists.get(\"list16\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<uint16_t>())"
               ,(DebugComparison<unsigned_int,_unsigned_short> *)&_kjCondition_7,(uint *)&local_1f8,
               (unsigned_short *)&local_200);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
    DynamicValue::Builder::~Builder((Builder *)&l);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
  }
  name_39.content.size_ = 7;
  name_39.content.ptr = "list32";
  DynamicStruct::Builder::get((Builder *)&_kjCondition,&lists,name_39);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&f,(Builder *)&_kjCondition);
  DynamicList::Builder::operator[]((Builder *)&l,(Builder *)&f,0);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)&_kjCondition_27,(Builder *)&l);
  name_40.content.size_ = 2;
  name_40.content.ptr = "f";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_23,(Builder *)&_kjCondition_27,name_40);
  uVar6 = DynamicValue::Builder::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                    ((Builder *)&_kjCondition_23);
  _kjCondition_7.left = (Void *)CONCAT44(uVar6,0x75bcd15);
  _kjCondition_7._8_8_ = anon_var_dwarf_a914;
  _kjCondition_7.op.content.ptr = &DAT_00000005;
  _kjCondition_7.op.content.size_ =
       CONCAT71(_kjCondition_7.op.content.size_._1_7_,uVar6 == 0x75bcd15);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
  DynamicValue::Builder::~Builder((Builder *)&l);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
  if (((char)_kjCondition_7.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    local_1f8._0_4_ = 0x75bcd15;
    name_41.content.size_ = 7;
    name_41.content.ptr = "list32";
    DynamicStruct::Builder::get((Builder *)&_kjCondition,&lists,name_41);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&f,(Builder *)&_kjCondition);
    DynamicList::Builder::operator[]((Builder *)&l,(Builder *)&f,0);
    DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicStruct> *)&_kjCondition_27,(Builder *)&l);
    name_42.content.size_ = 2;
    name_42.content.ptr = "f";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_23,(Builder *)&_kjCondition_27,name_42);
    uVar6 = DynamicValue::Builder::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                      ((Builder *)&_kjCondition_23);
    local_200 = (char *)CONCAT44(local_200._4_4_,uVar6);
    kj::_::Debug::
    log<char_const(&)[147],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x31e,ERROR,
               "\"failed: expected \" \"(123456789u) == (lists.get(\\\"list32\\\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\\\"f\\\").template as<uint32_t>())\", _kjCondition, 123456789u, lists.get(\"list32\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<uint32_t>()"
               ,(char (*) [147])
                "failed: expected (123456789u) == (lists.get(\"list32\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<uint32_t>())"
               ,(DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_7,(uint *)&local_1f8,
               (uint *)&local_200);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
    DynamicValue::Builder::~Builder((Builder *)&l);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
  }
  name_43.content.size_ = 7;
  name_43.content.ptr = "list32";
  DynamicStruct::Builder::get((Builder *)&_kjCondition,&lists,name_43);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&f,(Builder *)&_kjCondition);
  DynamicList::Builder::operator[]((Builder *)&l,(Builder *)&f,1);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)&_kjCondition_27,(Builder *)&l);
  name_44.content.size_ = 2;
  name_44.content.ptr = "f";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_23,(Builder *)&_kjCondition_27,name_44);
  uVar6 = DynamicValue::Builder::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                    ((Builder *)&_kjCondition_23);
  _kjCondition_7.left = (Void *)CONCAT44(uVar6,0xdfb38d2);
  _kjCondition_7._8_8_ = anon_var_dwarf_a914;
  _kjCondition_7.op.content.ptr = &DAT_00000005;
  _kjCondition_7.op.content.size_ =
       CONCAT71(_kjCondition_7.op.content.size_._1_7_,uVar6 == 0xdfb38d2);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
  DynamicValue::Builder::~Builder((Builder *)&l);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
  if (((char)_kjCondition_7.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    local_1f8._0_4_ = 0xdfb38d2;
    name_45.content.size_ = 7;
    name_45.content.ptr = "list32";
    DynamicStruct::Builder::get((Builder *)&_kjCondition,&lists,name_45);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&f,(Builder *)&_kjCondition);
    DynamicList::Builder::operator[]((Builder *)&l,(Builder *)&f,1);
    DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicStruct> *)&_kjCondition_27,(Builder *)&l);
    name_46.content.size_ = 2;
    name_46.content.ptr = "f";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_23,(Builder *)&_kjCondition_27,name_46);
    uVar6 = DynamicValue::Builder::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                      ((Builder *)&_kjCondition_23);
    local_200 = (char *)CONCAT44(local_200._4_4_,uVar6);
    kj::_::Debug::
    log<char_const(&)[147],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,799,ERROR,
               "\"failed: expected \" \"(234567890u) == (lists.get(\\\"list32\\\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\\\"f\\\").template as<uint32_t>())\", _kjCondition, 234567890u, lists.get(\"list32\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<uint32_t>()"
               ,(char (*) [147])
                "failed: expected (234567890u) == (lists.get(\"list32\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<uint32_t>())"
               ,(DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_7,(uint *)&local_1f8,
               (uint *)&local_200);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
    DynamicValue::Builder::~Builder((Builder *)&l);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
  }
  name_47.content.size_ = 7;
  name_47.content.ptr = "list64";
  DynamicStruct::Builder::get((Builder *)&_kjCondition,&lists,name_47);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&f,(Builder *)&_kjCondition);
  DynamicList::Builder::operator[]((Builder *)&l,(Builder *)&f,0);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)&_kjCondition_27,(Builder *)&l);
  name_48.content.size_ = 2;
  name_48.content.ptr = "f";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_23,(Builder *)&_kjCondition_27,name_48);
  _kjCondition_7._8_8_ =
       DynamicValue::Builder::AsImpl<unsigned_long,_(capnp::Kind)0>::apply
                 ((Builder *)&_kjCondition_23);
  _kjCondition_7.result = _kjCondition_7._8_8_ == 0x462d53c8abac0;
  _kjCondition_7.left = (Void *)0x462d53c8abac0;
  _kjCondition_7.op.content.ptr = " == ";
  _kjCondition_7.op.content.size_ = 5;
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
  DynamicValue::Builder::~Builder((Builder *)&l);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
  if ((_kjCondition_7.result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_1f8._0_8_ = 0x462d53c8abac0;
    name_49.content.size_ = 7;
    name_49.content.ptr = "list64";
    DynamicStruct::Builder::get((Builder *)&_kjCondition,&lists,name_49);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&f,(Builder *)&_kjCondition);
    DynamicList::Builder::operator[]((Builder *)&l,(Builder *)&f,0);
    DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicStruct> *)&_kjCondition_27,(Builder *)&l);
    name_50.content.size_ = 2;
    name_50.content.ptr = "f";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_23,(Builder *)&_kjCondition_27,name_50);
    local_200 = (char *)DynamicValue::Builder::AsImpl<unsigned_long,_(capnp::Kind)0>::apply
                                  ((Builder *)&_kjCondition_23);
    kj::_::Debug::
    log<char_const(&)[154],kj::_::DebugComparison<unsigned_long,unsigned_long>&,unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,800,ERROR,
               "\"failed: expected \" \"(1234567890123456u) == (lists.get(\\\"list64\\\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\\\"f\\\").template as<uint64_t>())\", _kjCondition, 1234567890123456u, lists.get(\"list64\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<uint64_t>()"
               ,(char (*) [154])
                "failed: expected (1234567890123456u) == (lists.get(\"list64\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<uint64_t>())"
               ,(DebugComparison<unsigned_long,_unsigned_long> *)&_kjCondition_7,
               (unsigned_long *)&local_1f8,(unsigned_long *)&local_200);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
    DynamicValue::Builder::~Builder((Builder *)&l);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
  }
  name_51.content.size_ = 7;
  name_51.content.ptr = "list64";
  DynamicStruct::Builder::get((Builder *)&_kjCondition,&lists,name_51);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&f,(Builder *)&_kjCondition);
  DynamicList::Builder::operator[]((Builder *)&l,(Builder *)&f,1);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)&_kjCondition_27,(Builder *)&l);
  name_52.content.size_ = 2;
  name_52.content.ptr = "f";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_23,(Builder *)&_kjCondition_27,name_52);
  _kjCondition_7._8_8_ =
       DynamicValue::Builder::AsImpl<unsigned_long,_(capnp::Kind)0>::apply
                 ((Builder *)&_kjCondition_23);
  _kjCondition_7.result = _kjCondition_7._8_8_ == 0x85561edaa4b87;
  _kjCondition_7.left = (Void *)0x85561edaa4b87;
  _kjCondition_7.op.content.ptr = " == ";
  _kjCondition_7.op.content.size_ = 5;
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
  DynamicValue::Builder::~Builder((Builder *)&l);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
  if ((_kjCondition_7.result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_1f8._0_8_ = 0x85561edaa4b87;
    name_53.content.size_ = 7;
    name_53.content.ptr = "list64";
    DynamicStruct::Builder::get((Builder *)&_kjCondition,&lists,name_53);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&f,(Builder *)&_kjCondition);
    DynamicList::Builder::operator[]((Builder *)&l,(Builder *)&f,1);
    DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicStruct> *)&_kjCondition_27,(Builder *)&l);
    name_54.content.size_ = 2;
    name_54.content.ptr = "f";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_23,(Builder *)&_kjCondition_27,name_54);
    local_200 = (char *)DynamicValue::Builder::AsImpl<unsigned_long,_(capnp::Kind)0>::apply
                                  ((Builder *)&_kjCondition_23);
    kj::_::Debug::
    log<char_const(&)[154],kj::_::DebugComparison<unsigned_long,unsigned_long>&,unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x321,ERROR,
               "\"failed: expected \" \"(2345678901234567u) == (lists.get(\\\"list64\\\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\\\"f\\\").template as<uint64_t>())\", _kjCondition, 2345678901234567u, lists.get(\"list64\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<uint64_t>()"
               ,(char (*) [154])
                "failed: expected (2345678901234567u) == (lists.get(\"list64\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<uint64_t>())"
               ,(DebugComparison<unsigned_long,_unsigned_long> *)&_kjCondition_7,
               (unsigned_long *)&local_1f8,(unsigned_long *)&local_200);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
    DynamicValue::Builder::~Builder((Builder *)&l);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
  }
  local_200 = "foo";
  name_55.content.size_ = 6;
  name_55.content.ptr = "listP";
  DynamicStruct::Builder::get((Builder *)&_kjCondition,&lists,name_55);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&_kjCondition_27,(Builder *)&_kjCondition);
  DynamicList::Builder::operator[]((Builder *)&l,(Builder *)&_kjCondition_27,0);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)&_kjCondition_7,(Builder *)&l);
  name_56.content.size_ = 2;
  name_56.content.ptr = "f";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_23,(Builder *)&_kjCondition_7,name_56);
  DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
            (&local_1f8,(Builder *)&_kjCondition_23);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)&f,
             (DebugExpression<char_const(&)[4]> *)&local_200,&local_1f8);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
  DynamicValue::Builder::~Builder((Builder *)&l);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
  if ((local_240 == false) && (kj::_::Debug::minSeverity < 3)) {
    name_57.content.size_ = 6;
    name_57.content.ptr = "listP";
    DynamicStruct::Builder::get((Builder *)&_kjCondition,&lists,name_57);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&_kjCondition_27,(Builder *)&_kjCondition);
    DynamicList::Builder::operator[]((Builder *)&l,(Builder *)&_kjCondition_27,0);
    DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicStruct> *)&_kjCondition_7,(Builder *)&l);
    name_58.content.size_ = 2;
    name_58.content.ptr = "f";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_23,(Builder *)&_kjCondition_7,name_58);
    DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
              (&local_1f8,(Builder *)&_kjCondition_23);
    kj::_::Debug::
    log<char_const(&)[137],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x322,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (lists.get(\\\"listP\\\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\\\"f\\\").template as<Text>())\", _kjCondition, \"foo\", lists.get(\"listP\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<Text>()"
               ,(char (*) [137])
                "failed: expected (\"foo\") == (lists.get(\"listP\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<Text>())"
               ,(DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)&f,(char (*) [4])"foo",
               &local_1f8);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
    DynamicValue::Builder::~Builder((Builder *)&l);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
  }
  local_200 = "bar";
  name_59.content.size_ = 6;
  name_59.content.ptr = "listP";
  DynamicStruct::Builder::get((Builder *)&_kjCondition,&lists,name_59);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&_kjCondition_27,(Builder *)&_kjCondition);
  DynamicList::Builder::operator[]((Builder *)&l,(Builder *)&_kjCondition_27,1);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)&_kjCondition_7,(Builder *)&l);
  name_60.content.size_ = 2;
  name_60.content.ptr = "f";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_23,(Builder *)&_kjCondition_7,name_60);
  DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
            (&local_1f8,(Builder *)&_kjCondition_23);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)&f,
             (DebugExpression<char_const(&)[4]> *)&local_200,&local_1f8);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
  DynamicValue::Builder::~Builder((Builder *)&l);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
  if ((local_240 == false) && (kj::_::Debug::minSeverity < 3)) {
    name_61.content.size_ = 6;
    name_61.content.ptr = "listP";
    DynamicStruct::Builder::get((Builder *)&_kjCondition,&lists,name_61);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&_kjCondition_27,(Builder *)&_kjCondition);
    DynamicList::Builder::operator[]((Builder *)&l,(Builder *)&_kjCondition_27,1);
    DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicStruct> *)&_kjCondition_7,(Builder *)&l);
    name_62.content.size_ = 2;
    name_62.content.ptr = "f";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_23,(Builder *)&_kjCondition_7,name_62);
    DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
              (&local_1f8,(Builder *)&_kjCondition_23);
    kj::_::Debug::
    log<char_const(&)[137],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x323,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (lists.get(\\\"listP\\\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\\\"f\\\").template as<Text>())\", _kjCondition, \"bar\", lists.get(\"listP\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<Text>()"
               ,(char (*) [137])
                "failed: expected (\"bar\") == (lists.get(\"listP\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<Text>())"
               ,(DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)&f,
               (char (*) [4])0x28e857,&local_1f8);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
    DynamicValue::Builder::~Builder((Builder *)&l);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
  }
  name_63.content.size_ = 0xe;
  name_63.content.ptr = "int32ListList";
  sVar7 = 0xe;
  DynamicStruct::Builder::get((Builder *)&_kjCondition_23,&lists,name_63);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            (&l,(Builder *)&_kjCondition_23);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
  _kjCondition_23.right = l.builder.elementCount;
  _kjCondition_23.left = 3;
  _kjCondition_23.op.content.ptr = " == ";
  _kjCondition_23.op.content.size_ = 5;
  bVar8 = l.builder.elementCount == 3;
  _kjCondition_23.result = bVar8;
  if (bVar8) {
    DynamicList::Builder::operator[](&local_70,&l,0);
    _kjCondition_23.left = 1;
    _kjCondition_23.right = 2;
    _kjCondition_23.op.content.ptr = (char *)CONCAT44(_kjCondition_23.op.content.ptr._4_4_,3);
    expected._M_len = sVar7;
    expected._M_array = (iterator)0x3;
    checkList<int,capnp::DynamicValue::Builder>((_ *)&local_70,(Builder *)&_kjCondition_23,expected)
    ;
    DynamicValue::Builder::~Builder(&local_70);
    DynamicList::Builder::operator[](&local_b0,&l,1);
    _kjCondition_23.left = 4;
    _kjCondition_23.right = 5;
    expected_00._M_len = sVar7;
    expected_00._M_array = (iterator)0x2;
    checkList<int,capnp::DynamicValue::Builder>
              ((_ *)&local_b0,(Builder *)&_kjCondition_23,expected_00);
    DynamicValue::Builder::~Builder(&local_b0);
    DynamicList::Builder::operator[](&local_f0,&l,2);
    _kjCondition_23.left = 0xbc4ff2;
    expected_01._M_len = sVar7;
    expected_01._M_array = (iterator)0x1;
    checkList<int,capnp::DynamicValue::Builder>
              ((_ *)&local_f0,(Builder *)&_kjCondition_23,expected_01);
    DynamicValue::Builder::~Builder(&local_f0);
    name_64.content.size_ = 0xd;
    name_64.content.ptr = "textListList";
    sVar7 = 0xd;
    DynamicStruct::Builder::get((Builder *)&_kjCondition_23,&lists,name_64);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              (&l,(Builder *)&_kjCondition_23);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
    _kjCondition_23.right = l.builder.elementCount;
    _kjCondition_23.left = 3;
    _kjCondition_23.op.content.ptr = " == ";
    _kjCondition_23.op.content.size_ = 5;
    _kjCondition_23.result = l.builder.elementCount == 3;
    if (l.builder.elementCount != 3) {
      f.exception._0_4_ = 3;
      _kjCondition_27.left = l.builder.elementCount;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ((Fault *)&_kjCondition,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x32f,FAILED,"(3u) == (l.size())","_kjCondition,3u, l.size()",&_kjCondition_23,
                 (uint *)&f,(uint *)&_kjCondition_27);
      kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
    }
    DynamicList::Builder::operator[](&local_130,&l,0);
    _kjCondition_23._0_8_ = anon_var_dwarf_a72e;
    _kjCondition_23.op.content.ptr = (char *)0x4;
    _kjCondition_23.op.content.size_ =
         (long)"\"failed: expected \" \"(\\\"foo\\\") == (bar)\", _kjCondition, \"foo\", bar" + 0x3f
    ;
    _kjCondition_23.result = true;
    _kjCondition_23._25_7_ = 0;
    expected_02._M_len = sVar7;
    expected_02._M_array = (iterator)0x2;
    checkList<capnp::Text,capnp::DynamicValue::Builder>
              ((_ *)&local_130,(Builder *)&_kjCondition_23,expected_02);
    DynamicValue::Builder::~Builder(&local_130);
    DynamicList::Builder::operator[](&local_170,&l,1);
    _kjCondition_23._0_8_ = (long)"foobarbaz" + 6;
    _kjCondition_23.op.content.ptr = (char *)0x4;
    expected_03._M_len = sVar7;
    expected_03._M_array = (iterator)0x1;
    checkList<capnp::Text,capnp::DynamicValue::Builder>
              ((_ *)&local_170,(Builder *)&_kjCondition_23,expected_03);
    DynamicValue::Builder::~Builder(&local_170);
    DynamicList::Builder::operator[](&local_1b0,&l,2);
    _kjCondition_23._0_8_ = (long)"bazqux" + 3;
    _kjCondition_23.op.content.ptr = (char *)0x4;
    _kjCondition_23.op.content.size_ = (size_t)anon_var_dwarf_b42aa;
    _kjCondition_23.result = true;
    _kjCondition_23._25_7_ = 0;
    expected_04._M_len = sVar7;
    expected_04._M_array = (iterator)0x2;
    checkList<capnp::Text,capnp::DynamicValue::Builder>
              ((_ *)&local_1b0,(Builder *)&_kjCondition_23,expected_04);
    DynamicValue::Builder::~Builder(&local_1b0);
    name_65.content.size_ = 0xf;
    name_65.content.ptr = "structListList";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_23,&lists,name_65);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              (&l,(Builder *)&_kjCondition_23);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
    _kjCondition_23.right = l.builder.elementCount;
    _kjCondition_23.left = 2;
    _kjCondition_23.op.content.ptr = " == ";
    _kjCondition_23.op.content.size_ = 5;
    bVar8 = l.builder.elementCount == 2;
    _kjCondition_23.result = bVar8;
    if (!bVar8) {
      f.exception._0_4_ = 2;
      _kjCondition_27.left = l.builder.elementCount;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ((Fault *)&_kjCondition,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x337,FAILED,"(2u) == (l.size())","_kjCondition,2u, l.size()",&_kjCondition_23,
                 (uint *)&f,(uint *)&_kjCondition_27);
      kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
    }
    DynamicList::Builder::operator[]((Builder *)&_kjCondition_23,&l,0);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&_kjCondition,(Builder *)&_kjCondition_23);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
    _kjCondition_23.right = uStack_2c0;
    _kjCondition_23.left = 2;
    _kjCondition_23.op.content.ptr = " == ";
    _kjCondition_23.op.content.size_ = 5;
    _kjCondition_23.result = uStack_2c0 == 2;
    if (uStack_2c0 != 2) {
      _kjCondition_27.left = 2;
      _kjCondition_7.left = (Void *)CONCAT44(_kjCondition_7.left._4_4_,uStack_2c0);
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x339,FAILED,"(2u) == (e.size())","_kjCondition,2u, e.size()",&_kjCondition_23,
                 (uint *)&_kjCondition_27,(uint *)&_kjCondition_7);
      kj::_::Debug::Fault::fatal(&f);
    }
    DynamicList::Builder::operator[]((Builder *)&_kjCondition_23,(Builder *)&_kjCondition,0);
    DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicStruct> *)&f,(Builder *)&_kjCondition_23);
    Schema::requireUsableAs((Schema *)&f,(RawSchema *)schemas::s_a0a8f314b80b63fd);
    _kjCondition_27.right =
         *(int *)((long)&(pCStack_258->super_CapTableReader)._vptr_CapTableReader + 4);
    _kjCondition_27.result = _kjCondition_27.right == 0x7b;
    _kjCondition_27.left = 0x7b;
    _kjCondition_27.op.content.ptr = " == ";
    _kjCondition_27.op.content.size_ = 5;
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
    if ((_kjCondition_27.result == false) && (kj::_::Debug::minSeverity < 3)) {
      _kjCondition_7.left = (Void *)CONCAT44(_kjCondition_7.left._4_4_,0x7b);
      DynamicList::Builder::operator[]((Builder *)&_kjCondition_23,(Builder *)&_kjCondition,0);
      DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                ((BuilderFor<DynamicStruct> *)&f,(Builder *)&_kjCondition_23);
      Schema::requireUsableAs((Schema *)&f,(RawSchema *)schemas::s_a0a8f314b80b63fd);
      local_1f8._0_4_ =
           *(undefined4 *)((long)&(pCStack_258->super_CapTableReader)._vptr_CapTableReader + 4);
      kj::_::Debug::log<char_const(&)[77],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x33a,ERROR,
                 "\"failed: expected \" \"(123) == (e[0].template as<TestAllTypes>().getInt32Field())\", _kjCondition, 123, e[0].template as<TestAllTypes>().getInt32Field()"
                 ,(char (*) [77])
                  "failed: expected (123) == (e[0].template as<TestAllTypes>().getInt32Field())",
                 &_kjCondition_27,(int *)&_kjCondition_7,(int *)&local_1f8);
      DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
    }
    DynamicList::Builder::operator[]((Builder *)&_kjCondition_23,(Builder *)&_kjCondition,1);
    DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicStruct> *)&f,(Builder *)&_kjCondition_23);
    Schema::requireUsableAs((Schema *)&f,(RawSchema *)schemas::s_a0a8f314b80b63fd);
    iVar1 = *(int *)((long)&(pCStack_258->super_CapTableReader)._vptr_CapTableReader + 4);
    _kjCondition_27.result = iVar1 == 0x1c8;
    _kjCondition_27.left = 0x1c8;
    _kjCondition_27.op.content.ptr = " == ";
    _kjCondition_27.op.content.size_ = 5;
    _kjCondition_27.right = iVar1;
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
    if ((iVar1 != 0x1c8) && (kj::_::Debug::minSeverity < 3)) {
      _kjCondition_7.left = (Void *)CONCAT44(_kjCondition_7.left._4_4_,0x1c8);
      DynamicList::Builder::operator[]((Builder *)&_kjCondition_23,(Builder *)&_kjCondition,1);
      DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                ((BuilderFor<DynamicStruct> *)&f,(Builder *)&_kjCondition_23);
      Schema::requireUsableAs((Schema *)&f,(RawSchema *)schemas::s_a0a8f314b80b63fd);
      local_1f8._0_4_ =
           *(undefined4 *)((long)&(pCStack_258->super_CapTableReader)._vptr_CapTableReader + 4);
      kj::_::Debug::log<char_const(&)[77],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x33b,ERROR,
                 "\"failed: expected \" \"(456) == (e[1].template as<TestAllTypes>().getInt32Field())\", _kjCondition, 456, e[1].template as<TestAllTypes>().getInt32Field()"
                 ,(char (*) [77])
                  "failed: expected (456) == (e[1].template as<TestAllTypes>().getInt32Field())",
                 &_kjCondition_27,(int *)&_kjCondition_7,(int *)&local_1f8);
      DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
    }
    DynamicList::Builder::operator[]((Builder *)&_kjCondition_23,&l,1);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&f,(Builder *)&_kjCondition_23);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
    _kjCondition_23.right = uStack_248;
    _kjCondition_23.left = 1;
    _kjCondition_23.op.content.ptr = " == ";
    _kjCondition_23.op.content.size_ = 5;
    _kjCondition_23.result = uStack_248 == 1;
    if (uStack_248 == 1) {
      DynamicList::Builder::operator[]((Builder *)&_kjCondition_23,(Builder *)&_kjCondition,0);
      DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                ((BuilderFor<DynamicStruct> *)&f,(Builder *)&_kjCondition_23);
      Schema::requireUsableAs((Schema *)&f,(RawSchema *)schemas::s_a0a8f314b80b63fd);
      iVar1 = *(int *)((long)&(pCStack_258->super_CapTableReader)._vptr_CapTableReader + 4);
      _kjCondition_27.result = iVar1 == 0x315;
      _kjCondition_27.left = 0x315;
      _kjCondition_27.op.content.ptr = " == ";
      _kjCondition_27.op.content.size_ = 5;
      _kjCondition_27.right = iVar1;
      DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
      if ((iVar1 != 0x315) && (kj::_::Debug::minSeverity < 3)) {
        _kjCondition_7.left = (Void *)CONCAT44(_kjCondition_7.left._4_4_,0x315);
        DynamicList::Builder::operator[]((Builder *)&_kjCondition_23,(Builder *)&_kjCondition,0);
        DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                  ((BuilderFor<DynamicStruct> *)&f,(Builder *)&_kjCondition_23);
        Schema::requireUsableAs((Schema *)&f,(RawSchema *)schemas::s_a0a8f314b80b63fd);
        local_1f8._0_4_ =
             *(undefined4 *)((long)&(pCStack_258->super_CapTableReader)._vptr_CapTableReader + 4);
        kj::_::Debug::log<char_const(&)[77],kj::_::DebugComparison<int,int>&,int,int>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x33e,ERROR,
                   "\"failed: expected \" \"(789) == (e[0].template as<TestAllTypes>().getInt32Field())\", _kjCondition, 789, e[0].template as<TestAllTypes>().getInt32Field()"
                   ,(char (*) [77])
                    "failed: expected (789) == (e[0].template as<TestAllTypes>().getInt32Field())",
                   &_kjCondition_27,(int *)&_kjCondition_7,(int *)&local_1f8);
        DynamicValue::Builder::~Builder((Builder *)&_kjCondition_23);
      }
      return;
    }
    _kjCondition_27.left = 1;
    _kjCondition_7.left = (Void *)CONCAT44(_kjCondition_7.left._4_4_,uStack_248);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x33d,FAILED,"(1u) == (e.size())","_kjCondition,1u, e.size()",&_kjCondition_23,
               (uint *)&_kjCondition_27,(uint *)&_kjCondition_7);
    kj::_::Debug::Fault::fatal(&f);
  }
  f.exception._0_4_ = 3;
  _kjCondition_27.left = l.builder.elementCount;
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
            ((Fault *)&_kjCondition,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
             ,0x327,FAILED,"(3u) == (l.size())","_kjCondition,3u, l.size()",&_kjCondition_23,
             (uint *)&f,(uint *)&_kjCondition_27);
  kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
}

Assistant:

void dynamicCheckListDefaults(Reader reader) {
  auto lists = reader.get("lists").as<DynamicStruct>();

  ASSERT_EQ(2u, lists.get("list0").as<DynamicList>().size());
  ASSERT_EQ(4u, lists.get("list1").as<DynamicList>().size());
  ASSERT_EQ(2u, lists.get("list8").as<DynamicList>().size());
  ASSERT_EQ(2u, lists.get("list16").as<DynamicList>().size());
  ASSERT_EQ(2u, lists.get("list32").as<DynamicList>().size());
  ASSERT_EQ(2u, lists.get("list64").as<DynamicList>().size());
  ASSERT_EQ(2u, lists.get("listP").as<DynamicList>().size());

  EXPECT_EQ(VOID, lists.get("list0").as<DynamicList>()[0].as<DynamicStruct>().get("f").as<Void>());
  EXPECT_EQ(VOID, lists.get("list0").as<DynamicList>()[1].as<DynamicStruct>().get("f").as<Void>());
  EXPECT_TRUE(lists.get("list1").as<DynamicList>()[0].as<DynamicStruct>().get("f").as<bool>());
  EXPECT_FALSE(lists.get("list1").as<DynamicList>()[1].as<DynamicStruct>().get("f").as<bool>());
  EXPECT_TRUE(lists.get("list1").as<DynamicList>()[2].as<DynamicStruct>().get("f").as<bool>());
  EXPECT_TRUE(lists.get("list1").as<DynamicList>()[3].as<DynamicStruct>().get("f").as<bool>());
  EXPECT_EQ(123u, lists.get("list8").as<DynamicList>()[0].as<DynamicStruct>().get("f").as<uint8_t>());
  EXPECT_EQ(45u, lists.get("list8").as<DynamicList>()[1].as<DynamicStruct>().get("f").as<uint8_t>());
  EXPECT_EQ(12345u, lists.get("list16").as<DynamicList>()[0].as<DynamicStruct>().get("f").as<uint16_t>());
  EXPECT_EQ(6789u, lists.get("list16").as<DynamicList>()[1].as<DynamicStruct>().get("f").as<uint16_t>());
  EXPECT_EQ(123456789u, lists.get("list32").as<DynamicList>()[0].as<DynamicStruct>().get("f").as<uint32_t>());
  EXPECT_EQ(234567890u, lists.get("list32").as<DynamicList>()[1].as<DynamicStruct>().get("f").as<uint32_t>());
  EXPECT_EQ(1234567890123456u, lists.get("list64").as<DynamicList>()[0].as<DynamicStruct>().get("f").as<uint64_t>());
  EXPECT_EQ(2345678901234567u, lists.get("list64").as<DynamicList>()[1].as<DynamicStruct>().get("f").as<uint64_t>());
  EXPECT_EQ("foo", lists.get("listP").as<DynamicList>()[0].as<DynamicStruct>().get("f").as<Text>());
  EXPECT_EQ("bar", lists.get("listP").as<DynamicList>()[1].as<DynamicStruct>().get("f").as<Text>());

  {
    auto l = lists.get("int32ListList").as<DynamicList>();
    ASSERT_EQ(3u, l.size());
    checkList<int32_t>(l[0], {1, 2, 3});
    checkList<int32_t>(l[1], {4, 5});
    checkList<int32_t>(l[2], {12341234});
  }

  {
    auto l = lists.get("textListList").as<DynamicList>();
    ASSERT_EQ(3u, l.size());
    checkList<Text>(l[0], {"foo", "bar"});
    checkList<Text>(l[1], {"baz"});
    checkList<Text>(l[2], {"qux", "corge"});
  }

  {
    auto l = lists.get("structListList").as<DynamicList>();
    ASSERT_EQ(2u, l.size());
    auto e = l[0].as<DynamicList>();
    ASSERT_EQ(2u, e.size());
    EXPECT_EQ(123, e[0].as<TestAllTypes>().getInt32Field());
    EXPECT_EQ(456, e[1].as<TestAllTypes>().getInt32Field());
    e = l[1].as<DynamicList>();
    ASSERT_EQ(1u, e.size());
    EXPECT_EQ(789, e[0].as<TestAllTypes>().getInt32Field());
  }
}